

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O1

void __thiscall soul::Optimisations::Inliner::~Inliner(Inliner *this)

{
  pointer ppVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  std::
  _Hashtable<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->remappedVariables)._M_h);
  std::
  _Hashtable<soul::pool_ref<soul::heart::Block>,_std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->remappedBlocks)._M_h);
  ppVar1 = (this->newBlocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1,(long)(this->newBlocks).
                                 super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar1);
  }
  pcVar2 = (this->inlinedFnName)._M_dataplus._M_p;
  paVar3 = &(this->inlinedFnName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Inliner (Module& m, heart::Function& parentFn, size_t block,
                 heart::FunctionCall& fc, heart::Function& targetFn)
            : module (m), parentFunction (parentFn), call (fc), blockIndex (block), targetFunction (targetFn)
        {
            inlinedFnName = addSuffixToMakeUnique ("_inlined_" + targetFunction.name.toString(),
                                                   [&] (const std::string& nm)
                                                   {
                                                       return heart::Utilities::findBlock (parentFn, "@" + nm) != nullptr;
                                                   });
        }